

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O3

int dwarf_load_rnglists(Dwarf_Debug dbg,Dwarf_Unsigned *rnglists_count,Dwarf_Error *error)

{
  Dwarf_Chain pDVar1;
  int iVar2;
  Dwarf_Rnglists_Context buildhere;
  char *pcVar3;
  Dwarf_Chain *ppDVar4;
  Dwarf_Rnglists_Context *ppDVar5;
  Dwarf_Signed errval;
  Dwarf_Chain space;
  Dwarf_Unsigned contextnum;
  Dwarf_Small *data;
  Dwarf_Unsigned DVar6;
  Dwarf_Chain local_68;
  Dwarf_Unsigned local_60;
  Dwarf_Error *local_58;
  Dwarf_Small *local_50;
  Dwarf_Unsigned nextoffset;
  Dwarf_Unsigned *local_40;
  Dwarf_Small *local_38;
  
  ppDVar4 = &local_68;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    pcVar3 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_load_rnglistseither null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    if (dbg->de_rnglists_context != (Dwarf_Rnglists_Context *)0x0) {
      if (rnglists_count != (Dwarf_Unsigned *)0x0) {
        *rnglists_count = dbg->de_rnglists_context_count;
        return 0;
      }
      return 0;
    }
    local_60 = (dbg->de_debug_rnglists).dss_size;
    if (local_60 == 0) {
      return -1;
    }
    local_50 = (dbg->de_debug_rnglists).dss_data;
    if (local_50 == (Dwarf_Small *)0x0) {
      iVar2 = _dwarf_load_section(dbg,&dbg->de_debug_rnglists,error);
      if (iVar2 != 0) {
        return iVar2;
      }
      local_50 = (dbg->de_debug_rnglists).dss_data;
      local_60 = (dbg->de_debug_rnglists).dss_size;
    }
    contextnum = 0;
    nextoffset = 0;
    local_68 = (Dwarf_Chain)0x0;
    local_58 = error;
    local_40 = rnglists_count;
    if (0 < (long)local_60) {
      local_38 = local_50 + local_60;
      contextnum = 0;
      data = local_50;
      do {
        DVar6 = nextoffset;
        buildhere = (Dwarf_Rnglists_Context)calloc(1,0x88);
        if (buildhere == (Dwarf_Rnglists_Context)0x0) {
          free_rnglists_chain(dbg,local_68);
          pcVar3 = "DW_DLE_ALLOC_FAIL: Allocation of Rnglists_Context failed";
          goto LAB_0017f0a0;
        }
        buildhere->rc_magic = 0xabcd;
        iVar2 = _dwarf_internal_read_rnglists_header
                          (dbg,1,contextnum,local_60,data,local_38,DVar6,buildhere,&nextoffset,
                           local_58);
        if (iVar2 == 1) {
LAB_0017f0cb:
          free(buildhere->rc_offset_value_array);
          free(buildhere);
          free_rnglists_chain(dbg,local_68);
          return 1;
        }
        buildhere->rc_magic = 0xabcd;
        pcVar3 = _dwarf_get_alloc(dbg,'\x1f',1);
        if (pcVar3 == (char *)0x0) {
          _dwarf_error_string(dbg,local_58,0x3e,
                              "DW_DLE_ALLOC_FAIL: allocating Rnglists_Context chain entry");
          goto LAB_0017f0cb;
        }
        *(Dwarf_Rnglists_Context *)pcVar3 = buildhere;
        contextnum = contextnum + 1;
        *ppDVar4 = (Dwarf_Chain)pcVar3;
        ppDVar4 = (Dwarf_Chain *)(pcVar3 + 0x10);
        data = local_50 + nextoffset;
      } while ((long)nextoffset < (long)local_60);
    }
    ppDVar5 = (Dwarf_Rnglists_Context *)malloc(contextnum * 8);
    if (ppDVar5 != (Dwarf_Rnglists_Context *)0x0) {
      if (contextnum != 0) {
        DVar6 = 0;
        space = local_68;
        do {
          ppDVar5[DVar6] = (Dwarf_Rnglists_Context)space->ch_item;
          space->ch_item = (void *)0x0;
          pDVar1 = space->ch_next;
          dwarf_dealloc(dbg,space,0x1f);
          DVar6 = DVar6 + 1;
          space = pDVar1;
        } while (contextnum != DVar6);
      }
      dbg->de_rnglists_context = ppDVar5;
      dbg->de_rnglists_context_count = contextnum;
      if (local_40 != (Dwarf_Unsigned *)0x0) {
        *local_40 = contextnum;
        return 0;
      }
      return 0;
    }
    free_rnglists_chain(dbg,local_68);
    pcVar3 = "Allocation of Rnglists_Context pointer array failed";
LAB_0017f0a0:
    errval = 0x3e;
    error = local_58;
  }
  _dwarf_error_string(dbg,error,errval,pcVar3);
  return 1;
}

Assistant:

int dwarf_load_rnglists(
    Dwarf_Debug dbg,
    Dwarf_Unsigned *rnglists_count,
    Dwarf_Error *error)
{
    int res = DW_DLV_ERROR;
    Dwarf_Rnglists_Context *cxt = 0;
    Dwarf_Unsigned count = 0;

    CHECK_DBG(dbg,error,"dwarf_load_rnglists");
    if (dbg->de_rnglists_context) {
        if (rnglists_count) {
            *rnglists_count = dbg->de_rnglists_context_count;
        }
        return DW_DLV_OK;
    }
    if (!dbg->de_debug_rnglists.dss_size) {
        /* nothing there. */
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_debug_rnglists.dss_data) {
        res = _dwarf_load_section(dbg, &dbg->de_debug_rnglists,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    res = internal_load_rnglists_contexts(dbg,&cxt,&count,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    dbg->de_rnglists_context = cxt;
    dbg->de_rnglists_context_count = count;
    if (rnglists_count) {
        *rnglists_count = count;
    }
    return DW_DLV_OK;
}